

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::do_actual_learning<false>(ldf *data,single_learner *base,multi_ex *ec_seq_all)

{
  action_score *paVar1;
  double dVar2;
  action_score *paVar3;
  bool bVar4;
  undefined1 uVar5;
  uint uVar6;
  size_type sVar7;
  reference ppeVar8;
  undefined8 uVar9;
  action_score **ppaVar10;
  size_t sVar11;
  v_array<ACTION_SCORE::action_score> *pvVar12;
  wclass *pwVar13;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  size_t in_RDI;
  float fVar14;
  size_t k_7;
  float prob;
  size_t k_6;
  float sum_prob;
  size_t k_5;
  size_t k_4;
  size_t k_3;
  example *ec_1;
  uint32_t k_2;
  float min_score;
  action_score s;
  example *ec;
  uint32_t k_1;
  uint32_t predicted_K;
  bool isTest;
  uint32_t k;
  uint32_t start_K;
  uint32_t K;
  stringstream __msg;
  multi_ex ec_seq;
  undefined4 in_stack_fffffffffffffd08;
  float fVar15;
  undefined4 in_stack_fffffffffffffd0c;
  v_array<v_array<ACTION_SCORE::action_score>_> *in_stack_fffffffffffffd10;
  vector<example_*,_std::allocator<example_*>_> *pvVar16;
  value_type peVar17;
  undefined4 in_stack_fffffffffffffd20;
  float in_stack_fffffffffffffd24;
  example *in_stack_fffffffffffffd28;
  example *in_stack_fffffffffffffd30;
  int plineNumber;
  char *in_stack_fffffffffffffd38;
  vw_exception *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  ldf *in_stack_fffffffffffffd68;
  value_type in_stack_fffffffffffffd70;
  ulong local_268;
  ulong local_258;
  float local_24c;
  ulong local_248;
  ulong local_240;
  ulong local_238;
  uint local_228;
  float local_224;
  uint local_20c;
  uint local_208;
  uint local_200;
  uint local_1fc;
  stringstream local_1d0 [16];
  stringstream local_1c0 [208];
  multi_ex *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  ldf *in_stack_ffffffffffffff20;
  vector<example_*,_std::allocator<example_*>_> *local_18;
  size_t local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  sVar7 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RDX);
  if (sVar7 != 0) {
    ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
    *(uint64_t *)(local_8 + 0xf0) = ((*ppeVar8)->super_example_predict).ft_offset;
    process_labels(in_stack_fffffffffffffd68,
                   (multi_ex *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
    sVar7 = std::vector<example_*,_std::allocator<example_*>_>::size
                      ((vector<example_*,_std::allocator<example_*>_> *)&stack0xffffffffffffffd0);
    if (sVar7 != 0) {
      bVar4 = ec_seq_has_label_definition
                        ((multi_ex *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
      if (bVar4) {
        std::__cxx11::stringstream::stringstream(local_1d0);
        plineNumber = (int)((ulong)in_stack_fffffffffffffd30 >> 0x20);
        std::operator<<((ostream *)(local_1d0 + 0x10),
                        "error: label definition encountered in data block");
        uVar9 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,plineNumber,
                   (string *)in_stack_fffffffffffffd28);
        __cxa_throw(uVar9,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      sVar7 = std::vector<example_*,_std::allocator<example_*>_>::size
                        ((vector<example_*,_std::allocator<example_*>_> *)&stack0xffffffffffffffd0);
      uVar6 = (uint)sVar7;
      local_1fc = 0;
      std::vector<example_*,_std::allocator<example_*>_>::operator[]
                ((vector<example_*,_std::allocator<example_*>_> *)&stack0xffffffffffffffd0,0);
      bVar4 = COST_SENSITIVE::ec_is_example_header(in_stack_fffffffffffffd28);
      if (bVar4) {
        local_1fc = 1;
        for (local_200 = 1; local_200 < uVar6; local_200 = local_200 + 1) {
          in_stack_fffffffffffffd68 = (ldf *)&stack0xffffffffffffffd0;
          ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              ((vector<example_*,_std::allocator<example_*>_> *)
                               in_stack_fffffffffffffd68,(ulong)local_200);
          in_stack_fffffffffffffd70 = *ppeVar8;
          std::vector<example_*,_std::allocator<example_*>_>::operator[]
                    ((vector<example_*,_std::allocator<example_*>_> *)in_stack_fffffffffffffd68,0);
          LabelDict::add_example_namespaces_from_example
                    (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        }
      }
      uVar5 = test_ldf_sequence(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                                in_stack_ffffffffffffff10);
      local_208 = local_1fc;
      if ((*(byte *)(local_8 + 200) & 1) == 0) {
        local_224 = 3.4028235e+38;
        for (local_228 = local_1fc; local_228 < uVar6; local_228 = local_228 + 1) {
          ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              ((vector<example_*,_std::allocator<example_*>_> *)
                               &stack0xffffffffffffffd0,(ulong)local_228);
          peVar17 = *ppeVar8;
          make_single_prediction
                    ((ldf *)in_stack_fffffffffffffd70,(single_learner *)in_stack_fffffffffffffd68,
                     (example *)CONCAT17(uVar5,in_stack_fffffffffffffd60));
          if (peVar17->partial_prediction < local_224) {
            local_224 = peVar17->partial_prediction;
            local_208 = local_228;
          }
        }
      }
      else {
        v_array<ACTION_SCORE::action_score>::clear
                  ((v_array<ACTION_SCORE::action_score> *)in_stack_fffffffffffffd10);
        v_array<v_array<ACTION_SCORE::action_score>_>::clear(in_stack_fffffffffffffd10);
        if (local_1fc != 0) {
          std::vector<example_*,_std::allocator<example_*>_>::operator[]
                    ((vector<example_*,_std::allocator<example_*>_> *)&stack0xffffffffffffffd0,0);
          v_array<v_array<ACTION_SCORE::action_score>_>::push_back
                    (in_stack_fffffffffffffd10,
                     (v_array<ACTION_SCORE::action_score> *)
                     CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        }
        for (local_20c = local_1fc; local_20c < uVar6; local_20c = local_20c + 1) {
          std::vector<example_*,_std::allocator<example_*>_>::operator[]
                    ((vector<example_*,_std::allocator<example_*>_> *)&stack0xffffffffffffffd0,
                     (ulong)local_20c);
          v_array<v_array<ACTION_SCORE::action_score>_>::push_back
                    (in_stack_fffffffffffffd10,
                     (v_array<ACTION_SCORE::action_score> *)
                     CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
          std::vector<example_*,_std::allocator<example_*>_>::operator[]
                    ((vector<example_*,_std::allocator<example_*>_> *)&stack0xffffffffffffffd0,
                     (ulong)local_20c);
          make_single_prediction
                    ((ldf *)in_stack_fffffffffffffd70,(single_learner *)in_stack_fffffffffffffd68,
                     (example *)CONCAT17(uVar5,in_stack_fffffffffffffd60));
          v_array<ACTION_SCORE::action_score>::push_back
                    ((v_array<ACTION_SCORE::action_score> *)in_stack_fffffffffffffd10,
                     (action_score *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        }
        ppaVar10 = v_array<ACTION_SCORE::action_score>::begin
                             ((v_array<ACTION_SCORE::action_score> *)(local_8 + 0xd0));
        paVar1 = *ppaVar10;
        sVar11 = v_array<ACTION_SCORE::action_score>::size
                           ((v_array<ACTION_SCORE::action_score> *)(local_8 + 0xd0));
        qsort(paVar1,sVar11,8,ACTION_SCORE::score_comp);
      }
      if ((*(byte *)(local_8 + 200) & 1) == 0) {
        for (local_240 = (ulong)local_1fc; local_240 < (sVar7 & 0xffffffff);
            local_240 = local_240 + 1) {
          if (local_240 == local_208) {
            ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                                ((vector<example_*,_std::allocator<example_*>_> *)
                                 &stack0xffffffffffffffd0,local_240);
            pwVar13 = v_array<COST_SENSITIVE::wclass>::operator[]
                                ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar8)->l).simple,0);
            in_stack_fffffffffffffd24 = (float)pwVar13->class_index;
            ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                                ((vector<example_*,_std::allocator<example_*>_> *)
                                 &stack0xffffffffffffffd0,local_240);
            ((*ppeVar8)->pred).scalar = in_stack_fffffffffffffd24;
          }
          else {
            ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                                ((vector<example_*,_std::allocator<example_*>_> *)
                                 &stack0xffffffffffffffd0,local_240);
            ((*ppeVar8)->pred).scalar = 0.0;
          }
        }
      }
      else {
        v_array<v_array<ACTION_SCORE::action_score>_>::operator[]
                  ((v_array<v_array<ACTION_SCORE::action_score>_> *)(local_8 + 0xf8),0);
        v_array<ACTION_SCORE::action_score>::clear
                  ((v_array<ACTION_SCORE::action_score> *)in_stack_fffffffffffffd10);
        if (local_1fc != 0) {
          pvVar12 = v_array<v_array<ACTION_SCORE::action_score>_>::operator[]
                              ((v_array<v_array<ACTION_SCORE::action_score>_> *)(local_8 + 0xf8),0);
          ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              ((vector<example_*,_std::allocator<example_*>_> *)
                               &stack0xffffffffffffffd0,0);
          peVar17 = *ppeVar8;
          (peVar17->pred).scalars._begin = (float *)pvVar12->_begin;
          (peVar17->pred).scalars._end = (float *)pvVar12->_end;
          (peVar17->pred).scalars.end_array = (float *)pvVar12->end_array;
          (peVar17->pred).scalars.erase_count = pvVar12->erase_count;
        }
        for (local_238 = (ulong)local_1fc; local_238 < (sVar7 & 0xffffffff);
            local_238 = local_238 + 1) {
          pvVar12 = v_array<v_array<ACTION_SCORE::action_score>_>::operator[]
                              ((v_array<v_array<ACTION_SCORE::action_score>_> *)(local_8 + 0xf8),
                               local_238);
          pvVar16 = (vector<example_*,_std::allocator<example_*>_> *)&stack0xffffffffffffffd0;
          ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              (pvVar16,local_238);
          peVar17 = *ppeVar8;
          paVar1 = pvVar12->_begin;
          paVar3 = pvVar12->_end;
          sVar11 = pvVar12->erase_count;
          (peVar17->pred).scalars.end_array = (float *)pvVar12->end_array;
          (peVar17->pred).scalars.erase_count = sVar11;
          (peVar17->pred).scalars._begin = (float *)paVar1;
          (peVar17->pred).scalars._end = (float *)paVar3;
          std::vector<example_*,_std::allocator<example_*>_>::operator[](pvVar16,0);
          v_array<ACTION_SCORE::action_score>::operator[]
                    ((v_array<ACTION_SCORE::action_score> *)(local_8 + 0xd0),local_238 - local_1fc);
          v_array<ACTION_SCORE::action_score>::push_back
                    ((v_array<ACTION_SCORE::action_score> *)in_stack_fffffffffffffd10,
                     (action_score *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        }
      }
      if (local_1fc != 0) {
        for (local_248 = 1; local_248 < (sVar7 & 0xffffffff); local_248 = local_248 + 1) {
          pvVar16 = (vector<example_*,_std::allocator<example_*>_> *)&stack0xffffffffffffffd0;
          ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              (pvVar16,local_248);
          peVar17 = *ppeVar8;
          std::vector<example_*,_std::allocator<example_*>_>::operator[](pvVar16,0);
          LabelDict::del_example_namespaces_from_example
                    ((example *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                     peVar17);
        }
      }
      if ((*(byte *)(local_8 + 0xbb) & 1) != 0) {
        local_24c = 0.0;
        for (local_258 = (ulong)local_1fc; local_258 < (sVar7 & 0xffffffff);
            local_258 = local_258 + 1) {
          ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              ((vector<example_*,_std::allocator<example_*>_> *)
                               &stack0xffffffffffffffd0,local_258);
          dVar2 = std::exp((double)(ulong)(uint)(*ppeVar8)->partial_prediction);
          fVar14 = 1.0 / (SUB84(dVar2,0) + 1.0);
          fVar15 = fVar14;
          ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              ((vector<example_*,_std::allocator<example_*>_> *)
                               &stack0xffffffffffffffd0,local_258);
          ((*ppeVar8)->pred).scalar = fVar15;
          local_24c = fVar14 + local_24c;
        }
        for (local_268 = (ulong)local_1fc; local_268 < (sVar7 & 0xffffffff);
            local_268 = local_268 + 1) {
          fVar15 = local_24c;
          ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              ((vector<example_*,_std::allocator<example_*>_> *)
                               &stack0xffffffffffffffd0,local_268);
          ((*ppeVar8)->pred).scalar = ((*ppeVar8)->pred).scalar / fVar15;
        }
      }
    }
    std::vector<example_*,_std::allocator<example_*>_>::~vector
              ((vector<example_*,_std::allocator<example_*>_> *)
               CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  }
  return;
}

Assistant:

void do_actual_learning(ldf& data, single_learner& base, multi_ex& ec_seq_all)
{
  if (ec_seq_all.size() == 0)
    return;  // nothing to do

  data.ft_offset = ec_seq_all[0]->ft_offset;

  // handle label definitions
  auto ec_seq = process_labels(data, ec_seq_all);
  if (ec_seq.size() == 0)
    return;  // nothing more to do

  // Ensure there are no more labels
  // (can be done in existing loops later but as a side effect learning
  //    will happen with bad example)
  if (ec_seq_has_label_definition(ec_seq))
  {
    THROW("error: label definition encountered in data block");
  }

  /////////////////////// add headers
  uint32_t K = (uint32_t)ec_seq.size();
  uint32_t start_K = 0;

  if (ec_is_example_header(*ec_seq[0]))
  {
    start_K = 1;
    for (uint32_t k = 1; k < K; k++) LabelDict::add_example_namespaces_from_example(*ec_seq[k], *ec_seq[0]);
  }
  bool isTest = test_ldf_sequence(data, start_K, ec_seq);
  /////////////////////// do prediction
  uint32_t predicted_K = start_K;
  if (data.rank)
  {
    data.a_s.clear();
    data.stored_preds.clear();
    if (start_K > 0)
      data.stored_preds.push_back(ec_seq[0]->pred.a_s);
    for (uint32_t k = start_K; k < K; k++)
    {
      data.stored_preds.push_back(ec_seq[k]->pred.a_s);
      example* ec = ec_seq[k];
      make_single_prediction(data, base, *ec);
      action_score s;
      s.score = ec->partial_prediction;
      s.action = k - start_K;
      data.a_s.push_back(s);
    }

    qsort((void*)data.a_s.begin(), data.a_s.size(), sizeof(action_score), score_comp);
  }
  else
  {
    float min_score = FLT_MAX;
    for (uint32_t k = start_K; k < K; k++)
    {
      example* ec = ec_seq[k];
      make_single_prediction(data, base, *ec);
      if (ec->partial_prediction < min_score)
      {
        min_score = ec->partial_prediction;
        predicted_K = k;
      }
    }
  }

  /////////////////////// learn
  if (is_learn && !isTest)
  {
    if (data.is_wap)
      do_actual_learning_wap(data, base, start_K, ec_seq);
    else
      do_actual_learning_oaa(data, base, start_K, ec_seq);
  }

  if (data.rank)
  {
    data.stored_preds[0].clear();
    if (start_K > 0)
    {
      ec_seq[0]->pred.a_s = data.stored_preds[0];
    }
    for (size_t k = start_K; k < K; k++)
    {
      ec_seq[k]->pred.a_s = data.stored_preds[k];
      ec_seq[0]->pred.a_s.push_back(data.a_s[k - start_K]);
    }
  }
  else
  {
    // Mark the predicted subexample with its class_index, all other with 0
    for (size_t k = start_K; k < K; k++)
    {
      if (k == predicted_K)
        ec_seq[k]->pred.multiclass = ec_seq[k]->l.cs.costs[0].class_index;
      else
        ec_seq[k]->pred.multiclass = 0;
    }
  }
  /////////////////////// remove header
  if (start_K > 0)
    for (size_t k = 1; k < K; k++) LabelDict::del_example_namespaces_from_example(*ec_seq[k], *ec_seq[0]);

  ////////////////////// compute probabilities
  if (data.is_probabilities)
  {
    float sum_prob = 0;
    for (size_t k = start_K; k < K; k++)
    {
      // probability(correct_class) = 1 / (1+exp(-score)), where score is higher for better classes,
      // but partial_prediction is lower for better classes (we are predicting the cost),
      // so we need to take score = -partial_prediction,
      // thus probability(correct_class) = 1 / (1+exp(-(-partial_prediction)))
      float prob = 1.f / (1.f + correctedExp(ec_seq[k]->partial_prediction));
      ec_seq[k]->pred.prob = prob;
      sum_prob += prob;
    }
    // make sure that the probabilities sum up (exactly) to one
    for (size_t k = start_K; k < K; k++)
    {
      ec_seq[k]->pred.prob /= sum_prob;
    }
  }
}